

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O0

QBrush * qvariant_cast<QBrush>(QVariant *v)

{
  long lVar1;
  bool bVar2;
  QMetaType QVar3;
  QBrush *pQVar4;
  QMetaType *pQVar5;
  void *pvVar6;
  QBrush *in_RDI;
  long in_FS_OFFSET;
  QBrush *t;
  QMetaType targetType;
  QMetaType *in_stack_ffffffffffffffa8;
  QBrush *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  QVar3 = QMetaType::fromType<QBrush>();
  QVariant::Private::type((Private *)this);
  bVar2 = operator==((QMetaType *)this,in_stack_ffffffffffffffa8);
  if (bVar2) {
    pQVar4 = QVariant::Private::get<QBrush>((Private *)0x5407d1);
    QBrush::QBrush(this,pQVar4);
  }
  else {
    *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
    QBrush::QBrush(this);
    pQVar5 = (QMetaType *)QVariant::metaType();
    pvVar6 = QVariant::constData((QVariant *)0x540812);
    QMetaType::convert(pQVar5,pvVar6,(QMetaType *)QVar3.d_ptr,this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

inline T qvariant_cast(const QVariant &v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType)
        return v.d.get<T>();
    if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}